

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

FunctionInfo * __thiscall
Js::DynamicProfileInfo::GetCallApplyTargetInfo
          (DynamicProfileInfo *this,FunctionBody *functionBody,ProfileId callSiteId)

{
  ushort uVar1;
  SourceId sourceId;
  code *pcVar2;
  bool bVar3;
  ProfileId PVar4;
  undefined4 *puVar5;
  ProfileId *pPVar6;
  CallSiteInfo **ppCVar7;
  ProfileId callApplyCallSiteId;
  ProfileId callSiteCount;
  ProfileId callSiteId_local;
  FunctionBody *functionBody_local;
  DynamicProfileInfo *this_local;
  
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x48f,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  PVar4 = FunctionBody::GetProfiledCallSiteCount(functionBody);
  if (PVar4 <= callSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x491,"(callSiteId < callSiteCount)","callSiteId < callSiteCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = FunctionProxy::IsJsBuiltInCode((FunctionProxy *)functionBody);
  if (!bVar3) {
    bVar3 = FunctionProxy::IsPublicLibraryCode((FunctionProxy *)functionBody);
    if (!bVar3) {
      bVar3 = HasCallSiteInfo(functionBody);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                    ,0x492,
                                    "(functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody))"
                                    ,
                                    "functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody)"
                                   );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  pPVar6 = FunctionBody::GetCallSiteToCallApplyCallSiteArray(functionBody);
  if (pPVar6 == (ProfileId *)0x0) {
    this_local = (DynamicProfileInfo *)0x0;
  }
  else {
    pPVar6 = FunctionBody::GetCallSiteToCallApplyCallSiteArray(functionBody);
    uVar1 = pPVar6[callSiteId];
    if (uVar1 == 0xffff) {
      this_local = (DynamicProfileInfo *)0x0;
    }
    else {
      PVar4 = FunctionBody::GetProfiledCallApplyCallSiteCount(functionBody);
      if (PVar4 <= uVar1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                    ,0x49c,
                                    "(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount())"
                                    ,
                                    "callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount()"
                                   );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      ppCVar7 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                          ((WriteBarrierPtr *)&this->callApplyTargetInfo);
      if (*(short *)&(*ppCVar7)[uVar1].field_0x2 < 0) {
        this_local = (DynamicProfileInfo *)0x0;
      }
      else {
        ppCVar7 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                            ((WriteBarrierPtr *)&this->callApplyTargetInfo);
        sourceId = (*ppCVar7)[uVar1].u.functionData.sourceId;
        ppCVar7 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                            ((WriteBarrierPtr *)&this->callApplyTargetInfo);
        this_local = (DynamicProfileInfo *)
                     GetFunctionInfo(functionBody,sourceId,
                                     (*ppCVar7)[uVar1].u.functionData.functionId);
      }
    }
  }
  return (FunctionInfo *)this_local;
}

Assistant:

FunctionInfo * DynamicProfileInfo::GetCallApplyTargetInfo(FunctionBody * functionBody, ProfileId callSiteId)
    {
        Assert(functionBody != nullptr);
        Js::ProfileId callSiteCount = functionBody->GetProfiledCallSiteCount();
        Assert(callSiteId < callSiteCount);
        Assert(functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody));

        if (functionBody->GetCallSiteToCallApplyCallSiteArray())
        {
            Js::ProfileId callApplyCallSiteId = functionBody->GetCallSiteToCallApplyCallSiteArray()[callSiteId];
            if (callApplyCallSiteId == Js::Constants::NoProfileId)
            {
                return nullptr;
            } 
            
            Assert(callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount());
            
            if (callApplyTargetInfo[callApplyCallSiteId].isPolymorphic)
            {
                return nullptr;
            }

            return GetFunctionInfo(functionBody, callApplyTargetInfo[callApplyCallSiteId].u.functionData.sourceId, callApplyTargetInfo[callApplyCallSiteId].u.functionData.functionId);
        }

        return nullptr;
    }